

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_iso9660.c
# Opt level: O1

int iso9660LoadEntries(PHYSFS_Io *io,int joliet,char *base,PHYSFS_uint64 dirstart,
                      PHYSFS_uint64 dirend,void *unpkarc)

{
  int iVar1;
  uint uVar2;
  time_t ts;
  PHYSFS_uint8 fnamelen;
  PHYSFS_uint8 flags;
  PHYSFS_uint8 second;
  PHYSFS_uint8 minute;
  PHYSFS_uint8 hour;
  PHYSFS_uint8 day;
  PHYSFS_uint8 month;
  PHYSFS_uint8 year;
  PHYSFS_uint8 extattrlen;
  PHYSFS_uint8 recordlen;
  PHYSFS_uint8 ignore [4];
  PHYSFS_uint8 offset;
  PHYSFS_uint32 extent;
  long local_1a0;
  uint local_194;
  int local_190;
  PHYSFS_uint32 datalen;
  char *local_188;
  void *local_180;
  PHYSFS_uint64 local_178;
  tm t;
  PHYSFS_uint8 fname [256];
  
  local_1a0 = 1;
  local_190 = joliet;
  local_188 = base;
  local_180 = unpkarc;
  local_178 = dirstart;
  iVar1 = (*io->seek)(io,dirstart);
  if ((iVar1 != 0) && (iVar1 = __PHYSFS_readAll(io,&recordlen,1), iVar1 != 0)) {
    if (recordlen == '\0') {
      uVar2 = 3;
      if ((dirstart - 1 < dirend - 0x800) &&
         (uVar2 = 2, (dirstart - 1 & 0xfffffffffffff800) + 0x800 == dirstart)) {
        PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
        iVar1 = (*(code *)(&DAT_0011e4d4 + *(int *)(&DAT_0011e4d4 + local_1a0 * 4)))();
        return iVar1;
      }
      goto LAB_0011a638;
    }
    iVar1 = __PHYSFS_readAll(io,&extattrlen,1);
    if (((((((iVar1 != 0) && (iVar1 = __PHYSFS_readAll(io,&extent,4), iVar1 != 0)) &&
           (iVar1 = __PHYSFS_readAll(io,ignore,4), iVar1 != 0)) &&
          ((iVar1 = __PHYSFS_readAll(io,&datalen,4), iVar1 != 0 &&
           (iVar1 = __PHYSFS_readAll(io,ignore,4), iVar1 != 0)))) &&
         ((iVar1 = __PHYSFS_readAll(io,&year,1), iVar1 != 0 &&
          ((iVar1 = __PHYSFS_readAll(io,&month,1), iVar1 != 0 &&
           (iVar1 = __PHYSFS_readAll(io,&day,1), iVar1 != 0)))))) &&
        (iVar1 = __PHYSFS_readAll(io,&hour,1), iVar1 != 0)) &&
       ((((iVar1 = __PHYSFS_readAll(io,&minute,1), iVar1 != 0 &&
          (iVar1 = __PHYSFS_readAll(io,&second,1), iVar1 != 0)) &&
         (iVar1 = __PHYSFS_readAll(io,&offset,1), iVar1 != 0)) &&
        (iVar1 = __PHYSFS_readAll(io,&flags,1), iVar1 != 0)))) {
      if ((char)flags < '\0') {
        PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
        iVar1 = (*(code *)(&DAT_0011e4d4 + *(int *)(&DAT_0011e4d4 + local_1a0 * 4)))();
        return iVar1;
      }
      local_194 = (uint)flags;
      iVar1 = __PHYSFS_readAll(io,ignore,1);
      if ((((iVar1 != 0) && (iVar1 = __PHYSFS_readAll(io,ignore,1), iVar1 != 0)) &&
          ((iVar1 = __PHYSFS_readAll(io,ignore,2), iVar1 != 0 &&
           ((iVar1 = __PHYSFS_readAll(io,ignore,2), iVar1 != 0 &&
            (iVar1 = __PHYSFS_readAll(io,&fnamelen,1), iVar1 != 0)))))) &&
         (iVar1 = __PHYSFS_readAll(io,fname,(ulong)fnamelen), iVar1 != 0)) {
        t.tm_sec = (int)second;
        t.tm_min = (int)minute;
        t.tm_hour = (int)hour;
        t.tm_mday = (int)day;
        t.tm_mon = month - 1;
        t.tm_year = (int)year;
        t.tm_wday = 0;
        t.tm_yday = 0;
        t.tm_isdst = -1;
        ts = mktime((tm *)&t);
        extent = extattrlen + extent;
        if (extent * 0x800 == local_178) {
          PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
          iVar1 = (*(code *)(&DAT_0011e4d4 + *(int *)(&DAT_0011e4d4 + local_1a0 * 4)))();
          return iVar1;
        }
        uVar2 = iso9660AddEntry(io,local_190,local_194 >> 1 & 1,local_188,fname,(uint)fnamelen,ts,
                                (ulong)(extent * 0x800),(ulong)datalen,local_180);
        uVar2 = uVar2 ^ 1;
        goto LAB_0011a638;
      }
    }
  }
  uVar2 = 1;
LAB_0011a638:
  iVar1 = (*(code *)(&DAT_0011e4d4 + *(int *)(&DAT_0011e4d4 + (ulong)uVar2 * 4)))();
  return iVar1;
}

Assistant:

static int iso9660LoadEntries(PHYSFS_Io *io, const int joliet,
                              const char *base, const PHYSFS_uint64 dirstart,
                              const PHYSFS_uint64 dirend, void *unpkarc)
{
    PHYSFS_uint64 readpos = dirstart;

    while (1)
    {
        PHYSFS_uint8 recordlen;
        PHYSFS_uint8 extattrlen;
        PHYSFS_uint32 extent;
        PHYSFS_uint32 datalen;
        PHYSFS_uint8 ignore[4];
        PHYSFS_uint8 year, month, day, hour, minute, second, offset;
        PHYSFS_uint8 flags;
        PHYSFS_uint8 fnamelen;
        PHYSFS_uint8 fname[256];
        PHYSFS_sint64 timestamp;
        struct tm t;
        int isdir;
        int multiextent;

        BAIL_IF_ERRPASS(!io->seek(io, readpos), 0);

        /* recordlen = 0 -> no more entries or fill entry */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &recordlen, 1), 0);
        if (recordlen > 0)
            readpos += recordlen;  /* ready to seek to next record. */
        else
        {
            PHYSFS_uint64 nextpos;

            /* if we are in the last sector of the directory & it's 0 -> end */
            if ((dirend - 2048) <= (readpos - 1))
                break; /* finished */

            /* else skip to the next sector & continue; */
            nextpos = (((readpos - 1) / 2048) + 1) * 2048;

            /* whoops, can't make forward progress! */
            BAIL_IF(nextpos == readpos, PHYSFS_ERR_CORRUPT, 0);

            readpos = nextpos;
            continue;  /* start back at upper loop. */
        } /* else */

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &extattrlen, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &extent, 4), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* extent be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &datalen, 4), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 4), 0); /* datalen be */

        /* record timestamp */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &year, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &month, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &day, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &hour, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &minute, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &second, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &offset, 1), 0);

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &flags, 1), 0);
        isdir = (flags & (1 << 1)) != 0;
        multiextent = (flags & (1 << 7)) != 0;
        BAIL_IF(multiextent, PHYSFS_ERR_UNSUPPORTED, 0);  /* !!! FIXME */

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 1), 0); /* unit size */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 1), 0); /* interleave gap */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 2), 0); /* seqnum le */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, ignore, 2), 0); /* seqnum be */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &fnamelen, 1), 0);
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, fname, fnamelen), 0);

        t.tm_sec = second;
        t.tm_min = minute;
        t.tm_hour = hour;
        t.tm_mday = day;
        t.tm_mon = month - 1;
        t.tm_year = year;
        t.tm_wday = 0;
        t.tm_yday = 0;
        t.tm_isdst = -1;
        timestamp = (PHYSFS_sint64) mktime(&t);

        extent += extattrlen;  /* skip extended attribute record. */

        /* infinite loop, corrupt file? */
        BAIL_IF((extent * 2048) == dirstart, PHYSFS_ERR_CORRUPT, 0);

        if (!iso9660AddEntry(io, joliet, isdir, base, fname, fnamelen,
                             timestamp, extent * 2048, datalen, unpkarc))
        {
            return 0;
        } /* if */
    } /* while */

    return 1;
}